

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableUpdateBorders(ImGuiTable *table)

{
  float y1;
  float fVar1;
  char cVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  int i;
  ImGuiTableInstanceData *pIVar5;
  char *pcVar6;
  ImGuiTableColumn *pIVar7;
  float fVar8;
  float local_64;
  float local_60;
  bool local_5a;
  bool local_59;
  undefined1 local_58 [5];
  bool pressed;
  bool held;
  bool hovered;
  ImRect hit_rect;
  ImGuiID column_id;
  float border_y2_hit;
  ImGuiTableColumn *column;
  int column_n;
  int order_n;
  float hit_y2_head;
  float hit_y2_body;
  float hit_y1;
  float hit_half_width;
  ImGuiTableInstanceData *table_instance;
  ImGuiContext *g;
  ImGuiTable *table_local;
  
  pIVar3 = GImGui;
  if ((table->Flags & 1U) == 0) {
    __assert_fail("table->Flags & ImGuiTableFlags_Resizable",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui_tables.cpp"
                  ,0x475,"void ImGui::TableUpdateBorders(ImGuiTable *)");
  }
  pIVar5 = TableGetInstanceData(table,(int)table->InstanceCurrent);
  y1 = (table->OuterRect).Min.y;
  fVar8 = ImMax<float>((table->OuterRect).Max.y,y1 + pIVar5->LastOuterHeight);
  fVar1 = pIVar5->LastFirstRowHeight;
  for (column._4_4_ = 0; column._4_4_ < table->ColumnsCount; column._4_4_ = column._4_4_ + 1) {
    if ((table->EnabledMaskByDisplayOrder & 1L << ((byte)column._4_4_ & 0x3f)) != 0) {
      pcVar6 = ImSpan<signed_char>::operator[](&table->DisplayOrderToIndex,column._4_4_);
      cVar2 = *pcVar6;
      i = (int)cVar2;
      pIVar7 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,i);
      if ((pIVar7->Flags & 0x40000020U) == 0) {
        local_60 = fVar8;
        if ((table->Flags & 0x800U) != 0) {
          local_60 = y1 + fVar1;
        }
        hit_rect.Max.y = local_60;
        if ((((table->Flags & 0x800U) == 0) || ((table->IsUsingHeaders & 1U) != 0)) &&
           (((pIVar7->IsVisibleX & 1U) != 0 || (table->LastResizedColumn == i)))) {
          hit_rect.Max.x = (float)TableGetColumnResizeID(table,i,(int)table->InstanceCurrent);
          ImRect::ImRect((ImRect *)local_58,pIVar7->MaxX - 4.0,y1,pIVar7->MaxX + 4.0,hit_rect.Max.y)
          ;
          KeepAliveID((ImGuiID)hit_rect.Max.x);
          local_59 = false;
          local_5a = false;
          bVar4 = ButtonBehavior((ImRect *)local_58,(ImGuiID)hit_rect.Max.x,&local_59,&local_5a,
                                 0x41910);
          if ((bVar4) && (bVar4 = IsMouseDoubleClicked(0), bVar4)) {
            TableSetColumnWidthAutoSingle(table,i);
            ClearActiveID();
            local_59 = false;
            local_5a = false;
          }
          if ((local_5a & 1U) != 0) {
            if (table->LastResizedColumn == -1) {
              if (table->RightMostEnabledColumn == -1) {
                local_64 = -3.4028235e+38;
              }
              else {
                pIVar7 = ImSpan<ImGuiTableColumn>::operator[]
                                   (&table->Columns,(int)table->RightMostEnabledColumn);
                local_64 = pIVar7->MaxX;
              }
              table->ResizeLockMinContentsX2 = local_64;
            }
            table->ResizedColumn = cVar2;
            table->InstanceInteracted = table->InstanceCurrent;
          }
          if ((((local_59 & 1U) != 0) && (0.06 < pIVar3->HoveredIdTimer)) || ((local_5a & 1U) != 0))
          {
            table->HoveredColumnBorder = cVar2;
            SetMouseCursor(4);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ImGui::TableUpdateBorders(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(table->Flags & ImGuiTableFlags_Resizable);

    // At this point OuterRect height may be zero or under actual final height, so we rely on temporal coherency and
    // use the final height from last frame. Because this is only affecting _interaction_ with columns, it is not
    // really problematic (whereas the actual visual will be displayed in EndTable() and using the current frame height).
    // Actual columns highlight/render will be performed in EndTable() and not be affected.
    ImGuiTableInstanceData* table_instance = TableGetInstanceData(table, table->InstanceCurrent);
    const float hit_half_width = TABLE_RESIZE_SEPARATOR_HALF_THICKNESS;
    const float hit_y1 = table->OuterRect.Min.y;
    const float hit_y2_body = ImMax(table->OuterRect.Max.y, hit_y1 + table_instance->LastOuterHeight);
    const float hit_y2_head = hit_y1 + table_instance->LastFirstRowHeight;

    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        if (!(table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)))
            continue;

        const int column_n = table->DisplayOrderToIndex[order_n];
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (column->Flags & (ImGuiTableColumnFlags_NoResize | ImGuiTableColumnFlags_NoDirectResize_))
            continue;

        // ImGuiTableFlags_NoBordersInBodyUntilResize will be honored in TableDrawBorders()
        const float border_y2_hit = (table->Flags & ImGuiTableFlags_NoBordersInBody) ? hit_y2_head : hit_y2_body;
        if ((table->Flags & ImGuiTableFlags_NoBordersInBody) && table->IsUsingHeaders == false)
            continue;

        if (!column->IsVisibleX && table->LastResizedColumn != column_n)
            continue;

        ImGuiID column_id = TableGetColumnResizeID(table, column_n, table->InstanceCurrent);
        ImRect hit_rect(column->MaxX - hit_half_width, hit_y1, column->MaxX + hit_half_width, border_y2_hit);
        //GetForegroundDrawList()->AddRect(hit_rect.Min, hit_rect.Max, IM_COL32(255, 0, 0, 100));
        KeepAliveID(column_id);

        bool hovered = false, held = false;
        bool pressed = ButtonBehavior(hit_rect, column_id, &hovered, &held, ImGuiButtonFlags_FlattenChildren | ImGuiButtonFlags_AllowItemOverlap | ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_PressedOnDoubleClick | ImGuiButtonFlags_NoNavFocus);
        if (pressed && IsMouseDoubleClicked(0))
        {
            TableSetColumnWidthAutoSingle(table, column_n);
            ClearActiveID();
            held = hovered = false;
        }
        if (held)
        {
            if (table->LastResizedColumn == -1)
                table->ResizeLockMinContentsX2 = table->RightMostEnabledColumn != -1 ? table->Columns[table->RightMostEnabledColumn].MaxX : -FLT_MAX;
            table->ResizedColumn = (ImGuiTableColumnIdx)column_n;
            table->InstanceInteracted = table->InstanceCurrent;
        }
        if ((hovered && g.HoveredIdTimer > TABLE_RESIZE_SEPARATOR_FEEDBACK_TIMER) || held)
        {
            table->HoveredColumnBorder = (ImGuiTableColumnIdx)column_n;
            SetMouseCursor(ImGuiMouseCursor_ResizeEW);
        }
    }
}